

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
worker_thread<directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,int number_of_threads,
          int thread_id,store_coboundaries_in_cache_t *f,int min_dimension,int max_dimension)

{
  size_type sVar1;
  size_type __n;
  store_coboundaries_in_cache_t *in_RCX;
  ushort in_DX;
  short in_SI;
  allocator_type *in_RDI;
  int in_R9D;
  vertex_index_t index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  vertex_index_t number_of_vertices;
  store_coboundaries_in_cache_t *in_stack_ffffffffffffff80;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  ushort local_56;
  int in_stack_ffffffffffffffb4;
  vertex_index_t *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  store_coboundaries_in_cache_t *in_stack_ffffffffffffffc8;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffffd0;
  
  sVar1 = std::
          vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
          ::size((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                  *)in_RDI);
  __n = (size_type)(in_R9D + 1);
  this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&stack0xffffffffffffffbf;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x1b1fa9);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(this_00,__n,in_RDI);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x1b1fc9);
  for (local_56 = in_DX; local_56 < (ushort)sVar1; local_56 = local_56 + in_SI) {
    std::
    vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
    ::operator[]((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                  *)in_RDI,(ulong)local_56);
    in_stack_ffffffffffffff80 = in_RCX;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1b201d);
    directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::done
            (in_stack_ffffffffffffff80);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI);
  return;
}

Assistant:

void worker_thread(int number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const vertex_index_t number_of_vertices = vertex_index_t(vertex_cells.size());

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		for (vertex_index_t index = thread_id; index < number_of_vertices; index += number_of_threads) {
			vertex_cells[index].for_each_cell(f, min_dimension, max_dimension, prefix.data());
		}

		f.done();
	}